

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O0

int __thiscall
GrcSymbolTable::AddGlyphAttrSymbolInMap
          (GrcSymbolTable *this,
          vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_> *vpsymGlyphAttrIDs,
          Symbol psymGeneric,int ipsymToAssign)

{
  size_type_conflict sVar1;
  reference ppGVar2;
  int in_ECX;
  GrcSymbolTableEntry *in_RDX;
  vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_> *in_RSI;
  value_type *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  int local_4;
  
  sVar1 = std::vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>::size(in_RSI);
  if (in_ECX < (int)sVar1) {
    GrcSymbolTableEntry::SetInternalID(in_RDX,in_ECX);
    ppGVar2 = std::vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>::operator[]
                        (in_RSI,(long)in_ECX);
    *ppGVar2 = in_RDX;
    local_4 = in_ECX;
  }
  else {
    while (sVar1 = std::vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>::size
                             (in_RSI), (int)sVar1 < in_ECX) {
      std::vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>::push_back
                ((vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_> *)0x0,
                 in_stack_ffffffffffffffc8);
    }
    GrcSymbolTableEntry::SetInternalID(in_RDX,in_ECX);
    std::vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>::push_back
              ((vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_> *)in_RDX,
               (value_type *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8));
    local_4 = in_ECX;
  }
  return local_4;
}

Assistant:

int GrcSymbolTable::AddGlyphAttrSymbolInMap(std::vector<Symbol> & vpsymGlyphAttrIDs,
	Symbol psymGeneric, int ipsymToAssign)
{
	if (signed(vpsymGlyphAttrIDs.size()) > ipsymToAssign)
	{
		Assert(vpsymGlyphAttrIDs[ipsymToAssign] == NULL ||
			vpsymGlyphAttrIDs[ipsymToAssign] == psymGeneric);
		psymGeneric->SetInternalID(ipsymToAssign);
		vpsymGlyphAttrIDs[ipsymToAssign] = psymGeneric;
		return ipsymToAssign;
	}